

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O1

uint64_t helper_psllh_mips64(uint64_t fs,uint64_t ft)

{
  long lVar1;
  uint uVar2;
  LMIValue vs;
  
  uVar2 = (uint)ft & 0x7f;
  if (0xf < uVar2) {
    return 0;
  }
  vs.d = fs;
  lVar1 = 0;
  do {
    *(short *)((long)&vs + lVar1 * 2) = *(short *)((long)&vs + lVar1 * 2) << ((byte)uVar2 & 0x1f);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return vs.d;
}

Assistant:

uint64_t helper_psllh(uint64_t fs, uint64_t ft)
{
    LMIValue vs;
    unsigned i;

    ft &= 0x7f;
    if (ft > 15) {
        return 0;
    }
    vs.d = fs;
    for (i = 0; i < 4; ++i) {
        vs.uh[i] <<= ft;
    }
    return vs.d;
}